

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O0

void __thiscall
capnp::compiler::CompilerMain::setRootType(kj::StringPtr)::CliArgumentErrorReporter::
addError(unsigned_int,unsigned_int,kj::StringPtr_
          (void *this,uint32_t startByte,uint32_t endByte,StringPtr message)

{
  undefined4 in_register_00000014;
  StringPtr *in_stack_ffffffffffffff48;
  String local_90;
  int local_74;
  String local_70;
  int local_44;
  String local_40;
  uint32_t local_28;
  uint32_t local_24;
  uint32_t endByte_local;
  uint32_t startByte_local;
  CliArgumentErrorReporter *this_local;
  StringPtr message_local;
  
  message_local.content.ptr = (char *)message.content.size_;
  this_local = (CliArgumentErrorReporter *)message.content.ptr;
  local_28 = endByte;
  local_24 = startByte;
  _endByte_local = this;
  if (startByte < endByte) {
    local_44 = startByte + 1;
    kj::str<unsigned_int,char_const(&)[2],unsigned_int&,char_const(&)[3],kj::StringPtr&>
              (&local_40,(kj *)&local_44,(uint *)0x3c3ed5,(char (*) [2])&local_28,(uint *)0x399f65,
               (char (*) [3])&this_local,in_stack_ffffffffffffff48);
    kj::Maybe<kj::String>::operator=((Maybe<kj::String> *)((long)this + 8),&local_40);
    kj::String::~String(&local_40);
  }
  else if (startByte == 0) {
    kj::str<kj::StringPtr&>
              (&local_90,(kj *)&this_local,(StringPtr *)CONCAT44(in_register_00000014,endByte));
    kj::Maybe<kj::String>::operator=((Maybe<kj::String> *)((long)this + 8),&local_90);
    kj::String::~String(&local_90);
  }
  else {
    local_74 = startByte + 1;
    kj::str<unsigned_int,char_const(&)[3],kj::StringPtr&>
              (&local_70,(kj *)&local_74,(uint *)0x399f65,(char (*) [3])&this_local,
               (StringPtr *)message_local.content.ptr);
    kj::Maybe<kj::String>::operator=((Maybe<kj::String> *)((long)this + 8),&local_70);
    kj::String::~String(&local_70);
  }
  return;
}

Assistant:

void addError(uint32_t startByte, uint32_t endByte, kj::StringPtr message) override {
        if (startByte < endByte) {
          error = kj::str(startByte + 1, "-", endByte, ": ", message);
        } else if (startByte > 0) {
          error = kj::str(startByte + 1, ": ", message);
        } else {
          error = kj::str(message);
        }
      }